

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkmanagerservice.cpp
# Opt level: O2

void __thiscall
QNetworkManagerInterface::QNetworkManagerInterface(QNetworkManagerInterface *this,QObject *parent)

{
  long lVar1;
  char cVar2;
  QNetworkManagerInterface QVar3;
  int iVar4;
  QDebug *this_00;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QLatin1String QVar5;
  QLatin1StringView latin1_02;
  QLatin1StringView latin1_03;
  QLatin1StringView latin1_04;
  QLatin1StringView latin1_05;
  QLatin1StringView latin1_06;
  QArrayDataPointer<char16_t> local_108;
  QDBusConnection local_f0 [8];
  QArrayDataPointer<char16_t> local_e8;
  QArrayDataPointer<char16_t> local_d0;
  char *local_b8;
  QDBusPendingReply<QMap<QString,_QVariant>_> propsReply;
  QArrayDataPointer<QVariant> local_a8;
  PropertiesDBusInterface local_88;
  QDBusError error;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QNetworkManagerInterfaceBase::QNetworkManagerInterfaceBase
            ((QNetworkManagerInterfaceBase *)this,parent);
  *(undefined ***)this = &PTR_metaObject_00113638;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  this[0x20] = (QNetworkManagerInterface)0x1;
  cVar2 = QDBusAbstractInterface::isValid();
  if (cVar2 != '\0') {
    local_88.super_QDBusAbstractInterface = (QDBusAbstractInterface)0xaa;
    local_88._1_7_ = 0xaaaaaaaaaaaaaa;
    local_88._8_8_ = 0xaaaaaaaaaaaaaaaa;
    latin1.m_data = "org.freedesktop.NetworkManager";
    latin1.m_size = 0x1e;
    QString::QString((QString *)&error,latin1);
    latin1_00.m_data = "/org/freedesktop/NetworkManager";
    latin1_00.m_size = 0x1f;
    QString::QString((QString *)&local_d0,latin1_00);
    latin1_01.m_data = "org.freedesktop.DBus.Properties";
    latin1_01.m_size = 0x1f;
    QString::QString((QString *)&local_a8,latin1_01);
    QDBusConnection::systemBus();
    PropertiesDBusInterface::PropertiesDBusInterface
              (&local_88,(QString *)&error,(QString *)&local_d0,(QString *)&local_a8,
               (QDBusConnection *)&local_e8,(QObject *)0x0);
    QDBusConnection::~QDBusConnection((QDBusConnection *)&local_e8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&error);
    local_a8.d = (Data *)0x0;
    local_a8.ptr = (QVariant *)0x0;
    local_a8.size = 0;
    QVar5.m_data = "org.freedesktop.NetworkManager";
    QVar5.m_size = 0x1e;
    QVariant::QVariant((QVariant *)&error,QVar5);
    QList<QVariant>::emplaceBack<QVariant>((QList<QVariant> *)&local_a8,(QVariant *)&error);
    QVariant::~QVariant((QVariant *)&error);
    propsReply = (QDBusPendingReply<QMap<QString,_QVariant>_>)0xaaaaaaaaaaaaaaaa;
    latin1_02.m_data = "GetAll";
    latin1_02.m_size = 6;
    QString::QString((QString *)&error,latin1_02);
    QDBusAbstractInterface::callWithArgumentList
              ((CallMode)&local_d0,(QString *)&local_88,(QList *)0x1);
    QDBusPendingReply<QMap<QString,_QVariant>_>::QDBusPendingReply
              (&propsReply,(QDBusMessage *)&local_d0);
    QDBusMessage::~QDBusMessage((QDBusMessage *)&local_d0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&error);
    cVar2 = QDBusPendingCall::isError();
    if (cVar2 == '\0') {
      QDBusPendingReply<QMap<QString,_QVariant>_>::argumentAt<0>
                ((QDBusPendingReply<QMap<QString,_QVariant>_> *)&error);
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
      ::operator=((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                   *)(this + 0x10),
                  (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                   *)&error);
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2
                ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                  *)&error);
      QDBusConnection::systemBus();
      latin1_03.m_data = "org.freedesktop.NetworkManager";
      latin1_03.m_size = 0x1e;
      QString::QString((QString *)&error,latin1_03);
      latin1_04.m_data = "/org/freedesktop/NetworkManager";
      latin1_04.m_size = 0x1f;
      QString::QString((QString *)&local_d0,latin1_04);
      latin1_05.m_data = "org.freedesktop.DBus.Properties";
      latin1_05.m_size = 0x1f;
      QString::QString((QString *)&local_e8,latin1_05);
      latin1_06.m_data = "PropertiesChanged";
      latin1_06.m_size = 0x11;
      QString::QString((QString *)&local_108,latin1_06);
      QVar3 = (QNetworkManagerInterface)
              QDBusConnection::connect
                        ((QString *)local_f0,(QString *)&error,(QString *)&local_d0,
                         (QString *)&local_e8,(QObject *)&local_108,(char *)this);
      this[0x20] = QVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&error);
      QDBusConnection::~QDBusConnection(local_f0);
    }
    else {
      this[0x20] = (QNetworkManagerInterface)0x0;
      _error = (Data *)0xaaaaaaaaaaaaaaaa;
      QDBusPendingCall::error();
      iVar4 = QDBusError::type();
      if (iVar4 != 9) {
        local_d0.d._0_4_ = 2;
        local_d0.size._4_4_ = 0;
        local_d0._4_8_ = 0;
        local_d0._12_8_ = 0;
        local_b8 = "default";
        QMessageLogger::warning();
        this_00 = QDebug::operator<<((QDebug *)&local_108,
                                     "Failed to query NetworkManager properties:");
        QDBusError::message();
        QDebug::operator<<(this_00,(QString *)&local_e8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
        QDebug::~QDebug((QDebug *)&local_108);
      }
      QDBusError::~QDBusError(&error);
    }
    QDBusPendingReplyBase::~QDBusPendingReplyBase(&propsReply.super_QDBusPendingReplyBase);
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_a8);
    QDBusAbstractInterface::~QDBusAbstractInterface(&local_88.super_QDBusAbstractInterface);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkManagerInterface::QNetworkManagerInterface(QObject *parent)
    : QNetworkManagerInterfaceBase(parent)
{
    if (!QDBusAbstractInterface::isValid())
        return;

    PropertiesDBusInterface managerPropertiesInterface(
            NM_DBUS_SERVICE, NM_DBUS_PATH, DBUS_PROPERTIES_INTERFACE,
            QDBusConnection::systemBus());
    QList<QVariant> argumentList;
    argumentList << NM_DBUS_SERVICE;
    QDBusPendingReply<QVariantMap> propsReply = managerPropertiesInterface.callWithArgumentList(
            QDBus::Block, "GetAll"_L1, argumentList);
    if (propsReply.isError()) {
        validDBusConnection = false;
        if (auto error = propsReply.error(); error.type() != QDBusError::AccessDenied)
            qWarning() << "Failed to query NetworkManager properties:" << error.message();
        return;
    }
    propertyMap = propsReply.value();

    validDBusConnection = QDBusConnection::systemBus().connect(NM_DBUS_SERVICE, NM_DBUS_PATH,
            DBUS_PROPERTIES_INTERFACE, propertiesChangedKey, this,
            SLOT(setProperties(QString,QMap<QString,QVariant>,QList<QString>)));
}